

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

intptr_t http_connect(char *url,char *unix_address,http_settings_s arg_settings)

{
  fio_str_info_s n;
  fio_connect_args args;
  http_settings_s arg_settings_00;
  undefined1 auVar1 [24];
  size_t sVar2;
  size_t sVar3;
  FIOBJ FVar4;
  char *__dest;
  undefined4 *__dest_00;
  int *piVar5;
  http_settings_s *phVar6;
  http_s *r;
  void *pvVar7;
  FIOBJ FVar8;
  FIOBJ FVar9;
  undefined8 *puVar10;
  intptr_t iVar11;
  fio_protocol_s *pfVar12;
  void *pvVar13;
  intptr_t extraout_RAX;
  long lVar14;
  bool bVar15;
  http_settings_s *settings;
  char *pcVar16;
  uintptr_t uuid;
  bool bVar17;
  byte bVar18;
  timespec tVar19;
  fio_url_s u;
  undefined1 in_stack_fffffffffffffdf0 [40];
  undefined1 in_stack_fffffffffffffe18 [39];
  char cVar20;
  undefined8 in_stack_fffffffffffffe60;
  fio_url_s local_160;
  undefined8 local_a0 [6];
  undefined1 local_70 [8];
  undefined8 local_68 [7];
  
  bVar18 = 0;
  if (arg_settings.on_upgrade == (_func_void_http_s_ptr_char_ptr_size_t *)0x0 &&
      arg_settings.on_response == (_func_void_http_s_ptr *)0x0) {
    if (FIO_LOG_LEVEL < 2) goto LAB_0014a005;
    pcVar16 = "ERROR: http_connect requires either an on_response  or an on_upgrade callback.\n";
  }
  else {
    if (url != (char *)0x0 || unix_address != (char *)0x0) {
      if (url == (char *)0x0) {
        cVar20 = true;
        sVar2 = 0;
        __dest = (char *)0x0;
        __dest_00 = (undefined4 *)0x0;
        pcVar16 = (char *)0x0;
        FVar4 = 0;
        goto LAB_0014a085;
      }
      sVar2 = strlen(url);
      fio_url_parse(&local_160,url,sVar2);
      if (local_160.scheme.data == (char *)0x0) {
switchD_00149e17_default:
        bVar17 = false;
        bVar15 = false;
      }
      else {
        switch(local_160.scheme.len) {
        case 2:
switchD_00149e17_caseD_2:
          if ((*local_160.scheme.data == 'w') && (local_160.scheme.data[1] == 's')) {
            bVar15 = true;
            sVar3 = 3;
LAB_00149eda:
            bVar17 = local_160.scheme.len == sVar3;
            if ((bVar17) && (arg_settings.tls == (void *)0x0)) {
              if (1 < FIO_LOG_LEVEL) {
                FIO_LOG2STDERR("ERROR: Secure connections (%.*s) require a TLS object.");
              }
              goto LAB_0014a005;
            }
          }
          else {
            if (local_160.scheme.len == 4) goto switchD_00149e17_caseD_4;
            bVar17 = false;
            bVar15 = false;
            if (local_160.scheme.len == 5) goto switchD_00149e17_caseD_5;
          }
          break;
        case 3:
          bVar17 = false;
          bVar15 = false;
          if (local_160.scheme.data[2] == 's') goto switchD_00149e17_caseD_2;
          break;
        case 4:
switchD_00149e17_caseD_4:
          bVar17 = false;
          bVar15 = false;
          if (((*local_160.scheme.data == 'h') && (bVar17 = false, local_160.scheme.data[1] == 't'))
             && (bVar17 = false, local_160.scheme.data[2] == 't')) {
            sVar3 = 5;
            bVar15 = false;
            bVar17 = false;
            if (local_160.scheme.data[3] == 'p') goto LAB_00149eda;
          }
          break;
        case 5:
switchD_00149e17_caseD_5:
          bVar17 = false;
          bVar15 = false;
          if (local_160.scheme.data[4] == 's') goto switchD_00149e17_caseD_4;
          break;
        default:
          goto switchD_00149e17_default;
        }
      }
      if (local_160.path.data == (char *)0x0) {
        FVar4 = 0;
      }
      else {
        sVar2 = strlen(local_160.path.data);
        FVar4 = fiobj_str_new(local_160.path.data,sVar2);
      }
      if (unix_address == (char *)0x0) {
        if (local_160.host.data == (char *)0x0) goto LAB_00149fee;
        __dest = (char *)fio_malloc(local_160.host.len + 1);
        sVar3 = local_160.host.len;
        memcpy(__dest,local_160.host.data,local_160.host.len);
        __dest[sVar3] = '\0';
        if (local_160.port.data == (char *)0x0) {
          if (bVar17) {
            __dest_00 = (undefined4 *)fio_malloc(4);
            *__dest_00 = 0x333434;
          }
          else {
            __dest_00 = (undefined4 *)fio_malloc(3);
            *(undefined2 *)__dest_00 = 0x3038;
            *(undefined1 *)((long)__dest_00 + 2) = 0;
          }
        }
        else {
          __dest_00 = (undefined4 *)fio_malloc(local_160.port.len + 1);
          memcpy(__dest_00,local_160.port.data,local_160.port.len);
          *(undefined1 *)((long)__dest_00 + local_160.port.len) = 0;
        }
        sVar2 = 0;
      }
      else {
        sVar2 = strlen(unix_address);
        __dest_00 = (undefined4 *)0x0;
        __dest = unix_address;
      }
      pcVar16 = unix_address;
      if (local_160.host.data != (char *)0x0) {
        sVar2 = local_160.host.len;
        pcVar16 = local_160.host.data;
      }
      cVar20 = !bVar15;
LAB_0014a085:
      if (arg_settings.timeout == '\0') {
        arg_settings.timeout = '\x1e';
      }
      settings = &arg_settings;
      puVar10 = (undefined8 *)&stack0xfffffffffffffdb8;
      for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar10 = settings->on_request;
        settings = (http_settings_s *)((long)settings + (ulong)bVar18 * -0x10 + 8);
        puVar10 = puVar10 + (ulong)bVar18 * -2 + 1;
      }
      arg_settings_00._40_39_ = in_stack_fffffffffffffe18;
      arg_settings_00.on_request = (_func_void_http_s_ptr *)in_stack_fffffffffffffdf0._0_8_;
      arg_settings_00.on_upgrade =
           (_func_void_http_s_ptr_char_ptr_size_t *)in_stack_fffffffffffffdf0._8_8_;
      arg_settings_00.on_response = (_func_void_http_s_ptr *)in_stack_fffffffffffffdf0._16_8_;
      arg_settings_00.on_finish = (_func_void_http_settings_s_ptr *)in_stack_fffffffffffffdf0._24_8_
      ;
      arg_settings_00.udata = (void *)in_stack_fffffffffffffdf0._32_8_;
      arg_settings_00.max_clients._7_1_ = cVar20;
      arg_settings_00.tls = (void *)FVar4;
      arg_settings_00.reserved1 = (intptr_t)__dest;
      arg_settings_00.reserved2 = sVar2;
      arg_settings_00.reserved3 = (intptr_t)pcVar16;
      arg_settings_00.ws_max_msg_size = in_stack_fffffffffffffe60;
      arg_settings_00._120_8_ = unix_address;
      phVar6 = http_settings_new(arg_settings_00);
      phVar6->is_client = '\x01';
      if (arg_settings.ws_timeout == '\0') {
        phVar6->ws_timeout = '\0';
      }
      if (arg_settings.timeout == '\0') {
        phVar6->timeout = '\0';
      }
      uuid = 0x80;
      r = (http_s *)fio_malloc(0x80);
      if (r != (http_s *)0x0) {
        pvVar7 = http1_vtable();
        FVar8 = fiobj_hash_new();
        tVar19 = fio_last_tick();
        FVar9 = fiobj_hash_new();
        pvVar13 = arg_settings.tls;
        (r->private_data).vtbl = pvVar7;
        (r->private_data).flag = 0;
        (r->private_data).out_headers = FVar8;
        r->received_at = tVar19;
        r->method = 0;
        r->status_str = 0;
        r->version = 0;
        r->query = 0;
        r->headers = FVar9;
        r->cookies = 0;
        r->params = 0;
        r->body = 0;
        r->udata = (void *)0x0;
        r->udata = arg_settings.udata;
        r->status = 0;
        r->path = FVar4;
        phVar6->udata = r;
        phVar6->tls = arg_settings.tls;
        if (pcVar16 != (char *)0x0) {
          n.data = "host";
          n.capa = SUB168(ZEXT816(4) << 0x40,0);
          n.len = SUB168(ZEXT816(4) << 0x40,8);
          auVar1._8_8_ = pcVar16;
          auVar1._0_8_ = sVar2;
          auVar1._16_8_ = 0;
          http_set_header2(r,n,(fio_str_info_s)(auVar1 << 0x40));
        }
        if (cVar20 == '\0') {
          puVar10 = (undefined8 *)(local_70 + 8);
        }
        else {
          puVar10 = local_a0;
        }
        *puVar10 = __dest;
        puVar10[1] = __dest_00;
        puVar10[2] = http_on_open_client;
        puVar10[3] = http_on_client_failed;
        puVar10[4] = pvVar13;
        puVar10[5] = phVar6;
        *(undefined1 *)(puVar10 + 6) = 0;
        args.on_connect = (_func_void_intptr_t_void_ptr *)in_stack_fffffffffffffdf0._0_8_;
        args.on_fail = (_func_void_intptr_t_void_ptr *)in_stack_fffffffffffffdf0._8_8_;
        args.tls = (void *)in_stack_fffffffffffffdf0._16_8_;
        args.udata = (void *)in_stack_fffffffffffffdf0._24_8_;
        args.timeout = in_stack_fffffffffffffdf0[0x20];
        args._49_7_ = in_stack_fffffffffffffdf0._33_7_;
        args._0_16_ = *(undefined1 (*) [16])(puVar10 + 5);
        iVar11 = fio_connect(args);
        if (__dest != unix_address) {
          fio_free(__dest);
        }
        fio_free(__dest_00);
        return iVar11;
      }
      http_connect_cold_1();
      puVar10 = (undefined8 *)settings->udata;
      fio_timeout_set(uuid,settings->timeout);
      pfVar12 = http1_new(uuid,settings,(void *)0x0,0);
      if (pfVar12 != (fio_protocol_s *)0x0) {
        settings[1].on_request = (_func_void_http_s_ptr *)pfVar12->on_close;
        pfVar12->on_close = http_on_close_client;
        puVar10[1] = pfVar12;
        pvVar13 = http1_vtable();
        *puVar10 = pvVar13;
        iVar11 = (*settings->on_response)((http_s *)settings->udata);
        return iVar11;
      }
      fio_close(uuid);
      return extraout_RAX;
    }
LAB_00149fee:
    if (FIO_LOG_LEVEL < 2) goto LAB_0014a005;
    pcVar16 = "ERROR: http_connect requires a valid address.";
  }
  FIO_LOG2STDERR(pcVar16);
LAB_0014a005:
  piVar5 = __errno_location();
  *piVar5 = 0x16;
  if (arg_settings.on_finish != (_func_void_http_settings_s_ptr *)0x0) {
    (*arg_settings.on_finish)(&arg_settings);
  }
  return -1;
}

Assistant:

intptr_t http_connect FIO_IGNORE_MACRO(const char *url,
                                       const char *unix_address,
                                       struct http_settings_s arg_settings) {
  if (!arg_settings.on_response && !arg_settings.on_upgrade) {
    FIO_LOG_ERROR("http_connect requires either an on_response "
                  " or an on_upgrade callback.\n");
    errno = EINVAL;
    goto on_error;
  }
  size_t len = 0, h_len = 0;
  char *a = NULL, *p = NULL, *host = NULL;
  uint8_t is_websocket = 0;
  uint8_t is_secure = 0;
  FIOBJ path = FIOBJ_INVALID;
  if (!url && !unix_address) {
    FIO_LOG_ERROR("http_connect requires a valid address.");
    errno = EINVAL;
    goto on_error;
  }
  if (url) {
    fio_url_s u = fio_url_parse(url, strlen(url));
    if (u.scheme.data &&
        (u.scheme.len == 2 || (u.scheme.len == 3 && u.scheme.data[2] == 's')) &&
        u.scheme.data[0] == 'w' && u.scheme.data[1] == 's') {
      is_websocket = 1;
      is_secure = (u.scheme.len == 3);
    } else if (u.scheme.data &&
               (u.scheme.len == 4 ||
                (u.scheme.len == 5 && u.scheme.data[4] == 's')) &&
               u.scheme.data[0] == 'h' && u.scheme.data[1] == 't' &&
               u.scheme.data[2] == 't' && u.scheme.data[3] == 'p') {
      is_secure = (u.scheme.len == 5);
    }
    if (is_secure && !arg_settings.tls) {
      FIO_LOG_ERROR("Secure connections (%.*s) require a TLS object.",
                    (int)u.scheme.len, u.scheme.data);
      errno = EINVAL;
      goto on_error;
    }
    if (u.path.data) {
      path = fiobj_str_new(
          u.path.data, strlen(u.path.data)); /* copy query and target as well */
    }
    if (unix_address) {
      a = (char *)unix_address;
      h_len = len = strlen(a);
      host = a;
    } else {
      if (!u.host.data) {
        FIO_LOG_ERROR("http_connect requires a valid address.");
        errno = EINVAL;
        goto on_error;
      }
      /***** no more error handling, since memory is allocated *****/
      /* copy address */
      a = fio_malloc(u.host.len + 1);
      memcpy(a, u.host.data, u.host.len);
      a[u.host.len] = 0;
      len = u.host.len;
      /* copy port */
      if (u.port.data) {
        p = fio_malloc(u.port.len + 1);
        memcpy(p, u.port.data, u.port.len);
        p[u.port.len] = 0;
      } else if (is_secure) {
        p = fio_malloc(3 + 1);
        memcpy(p, "443", 3);
        p[3] = 0;
      } else {
        p = fio_malloc(2 + 1);
        memcpy(p, "80", 2);
        p[2] = 0;
      }
    }
    if (u.host.data) {
      host = u.host.data;
      h_len = u.host.len;
    }
  }

  /* set settings */
  if (!arg_settings.timeout)
    arg_settings.timeout = 30;
  http_settings_s *settings = http_settings_new(arg_settings);
  settings->is_client = 1;
  // if (settings->tls) {
  //   fio_tls_alpn_add(settings->tls, "http/1.1", http_on_open_client_http1,
  //                     NULL, NULL);
  // }

  if (!arg_settings.ws_timeout)
    settings->ws_timeout = 0; /* allow server to dictate timeout */
  if (!arg_settings.timeout)
    settings->timeout = 0; /* allow server to dictate timeout */
  http_s *h = fio_malloc(sizeof(*h));
  FIO_ASSERT(h, "HTTP Client handler allocation failed");
  http_s_new(h, 0, http1_vtable());
  h->udata = arg_settings.udata;
  h->status = 0;
  h->path = path;
  settings->udata = h;
  settings->tls = arg_settings.tls;
  if (host)
    http_set_header2(h, (fio_str_info_s){.data = (char *)"host", .len = 4},
                     (fio_str_info_s){.data = host, .len = h_len});
  intptr_t ret;
  if (is_websocket) {
    /* force HTTP/1.1 */
    ret = fio_connect(.address = a, .port = p, .on_fail = http_on_client_failed,
                      .on_connect = http_on_open_client, .udata = settings,
                      .tls = arg_settings.tls);
    (void)0;
  } else {
    /* Allow for any HTTP version */
    ret = fio_connect(.address = a, .port = p, .on_fail = http_on_client_failed,
                      .on_connect = http_on_open_client, .udata = settings,
                      .tls = arg_settings.tls);
    (void)0;
  }
  if (a != unix_address)
    fio_free(a);
  fio_free(p);
  return ret;
on_error:
  if (arg_settings.on_finish)
    arg_settings.on_finish(&arg_settings);
  return -1;
}